

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall Wasm::WasmBytecodeGenerator::EnregisterLocals(WasmBytecodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint32 firstTmpReg;
  Local type;
  ulong in_RAX;
  WasmLocal *pWVar4;
  undefined4 *puVar5;
  WasmRegisterSpace *this_00;
  WasmLocal WVar6;
  ulong uVar7;
  
  firstTmpReg = WasmFunctionInfo::GetLocalCount(this->m_funcInfo);
  uVar7 = 0;
  pWVar4 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmLocal,false>
                     ((Memory *)&this->m_alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)firstTmpReg);
  this->m_locals = pWVar4;
  Js::FunctionBody::SetFirstTmpReg((this->m_funcInfo->m_body).ptr,firstTmpReg);
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (firstTmpReg == uVar7) {
      return;
    }
    type = WasmFunctionInfo::GetLocal(this->m_funcInfo,(uint32)uVar7);
    this_00 = GetRegisterSpace(this,type);
    WVar6.location = WAsmJs::RegisterSpace::AcquireRegister(this_00);
    WVar6.type = type;
    this->m_locals[uVar7] = WVar6;
    AVar3 = WasmFunctionInfo::GetParamCount(this->m_funcInfo);
    if (AVar3 <= uVar7) {
      switch(type) {
      case FirstLocalType:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[10])
                  (this->m_writer,9,(ulong)this->m_locals[uVar7].location,0);
        break;
      case I64:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xb])
                  (this->m_writer,0xb,(ulong)this->m_locals[uVar7].location,0);
        break;
      case F32:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xc])
                  (0,this->m_writer,0xd,(ulong)this->m_locals[uVar7].location);
        break;
      case F64:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xd])
                  (0,this->m_writer,0xf,(ulong)this->m_locals[uVar7].location);
        break;
      case V128:
        Simd::EnsureSimdIsEnabled();
        in_RAX = in_RAX & 0xffffffff00000000;
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0x17])
                  (this->m_writer,0x18b,(ulong)this->m_locals[uVar7].location,0,0,0,in_RAX);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x287,"((0))","(0)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void WasmBytecodeGenerator::EnregisterLocals()
{
    uint32 nLocals = m_funcInfo->GetLocalCount();
    m_locals = AnewArray(&m_alloc, WasmLocal, nLocals);

    m_funcInfo->GetBody()->SetFirstTmpReg(nLocals);
    for (uint32 i = 0; i < nLocals; ++i)
    {
        WasmTypes::WasmType type = m_funcInfo->GetLocal(i);
        WasmRegisterSpace* regSpace = GetRegisterSpace(type);
        m_locals[i] = WasmLocal(regSpace->AcquireRegister(), type);

        // Zero only the locals not corresponding to formal parameters.
        if (i >= m_funcInfo->GetParamCount()) {
            switch (type)
            {
            case WasmTypes::F32:
                m_writer->AsmFloat1Const1(Js::OpCodeAsmJs::Ld_FltConst, m_locals[i].location, 0.0f);
                break;
            case WasmTypes::F64:
                m_writer->AsmDouble1Const1(Js::OpCodeAsmJs::Ld_DbConst, m_locals[i].location, 0.0);
                break;
            case WasmTypes::I32:
                m_writer->AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, m_locals[i].location, 0);
                break;
            case WasmTypes::I64:
                m_writer->AsmLong1Const1(Js::OpCodeAsmJs::Ld_LongConst, m_locals[i].location, 0);
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
            {
                Simd::EnsureSimdIsEnabled();
                m_writer->WasmSimdConst(Js::OpCodeAsmJs::Simd128_LdC, m_locals[i].location, 0, 0, 0, 0);
                break;
            }
#endif
            default:
                Assume(UNREACHED);
            }
        }
    }
}